

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cpp
# Opt level: O1

string * __thiscall
duckdb::FileSystem::JoinPath(string *__return_storage_ptr__,FileSystem *this,string *a,string *b)

{
  size_type sVar1;
  pointer pcVar2;
  long lVar3;
  long *plVar4;
  long *plVar5;
  size_type *psVar6;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  sVar1 = a->_M_string_length;
  if (sVar1 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (b->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + b->_M_string_length);
  }
  else {
    (*this->_vptr_FileSystem[0x18])(local_48);
    plVar4 = (long *)::std::__cxx11::string::replace
                               ((ulong)local_48,0,(char *)0x0,(ulong)(a->_M_dataplus)._M_p);
    local_68 = &local_58;
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_58 = *plVar5;
      lStack_50 = plVar4[3];
    }
    else {
      local_58 = *plVar5;
      local_68 = (long *)*plVar4;
    }
    local_60 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)::std::__cxx11::string::_M_append
                               ((char *)&local_68,(ulong)(b->_M_dataplus)._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar6) {
      lVar3 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
  }
  if (sVar1 != 0) {
    if (local_68 != &local_58) {
      operator_delete(local_68);
    }
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string FileSystem::JoinPath(const string &a, const string &b) {
	// FIXME: sanitize paths
	return a.empty() ? b : a + PathSeparator(a) + b;
}